

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

cave_profile * find_cave_profile(char *name)

{
  ushort uVar1;
  cave_profile *pcVar2;
  int iVar3;
  ulong uVar4;
  cave_profile *pcVar5;
  
  uVar1 = z_info->profile_max;
  pcVar5 = cave_profiles + -1;
  uVar4 = 0xffffffffffffffff;
  do {
    uVar4 = uVar4 + 1;
    if (uVar1 <= uVar4) {
      return (cave_profile *)0x0;
    }
    pcVar2 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
    iVar3 = strcmp(name,pcVar2->name);
  } while (iVar3 != 0);
  return pcVar5;
}

Assistant:

static const struct cave_profile *find_cave_profile(const char *name)
{
	int i;

	for (i = 0; i < z_info->profile_max; i++) {
		const struct cave_profile *profile;

		profile = &cave_profiles[i];
		if (streq(name, profile->name))
			return profile;
	}

	/* Not there */
	return NULL;
}